

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall MakefileGenerator::writePrlFile(MakefileGenerator *this,QTextStream *t)

{
  qsizetype qVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  ProString *pPVar4;
  Data *pDVar5;
  Data *pDVar6;
  bool bVar7;
  bool bVar8;
  QTextStream *pQVar9;
  ProStringList *pPVar10;
  iterator iVar11;
  iterator iVar12;
  QString *pQVar13;
  char *str;
  QMakeProject *pQVar14;
  ProString *pPVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  ProString local_138;
  ProString local_108;
  QArrayDataPointer<ProString> local_d8;
  ProString local_b8;
  ProString local_88;
  QString local_58;
  long local_38;
  
  qVar1 = Option::output_dir.d.size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = Option::output_dir.d.d;
  local_58.d.ptr = Option::output_dir.d.ptr;
  local_58.d.size = Option::output_dir.d.size;
  if (Option::output_dir.d.d != (Data *)0x0) {
    LOCK();
    ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  if (qVar1 == 0) {
    qmake_getpwd();
    pcVar2 = local_58.d.ptr;
    pDVar6 = local_58.d.d;
    qVar1 = local_88.m_string.d.size;
    pDVar5 = local_88.m_string.d.d;
    pPVar15 = (ProString *)local_58.d.d;
    qVar3 = local_58.d.size;
    pPVar4 = (ProString *)local_88.m_string.d.d;
    local_58.d.ptr = local_88.m_string.d.ptr;
    local_88.m_string.d.d = local_58.d.d;
    local_58.d.d = pDVar5;
    local_88.m_string.d.ptr = pcVar2;
    local_88.m_string.d.size = local_58.d.size;
    local_58.d.size = qVar1;
    if ((ProString *)pDVar6 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&pDVar6->super_QArrayData)->d).d =
           *(int *)&(((QString *)&pDVar6->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&pDVar6->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_BUILD_DIR =");
  ProString::ProString(&local_88,&local_58);
  qv(&local_b8.m_string,&local_88);
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_b8);
  Qt::endl(pQVar9);
  if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRO_INPUT =");
  pQVar14 = this->project;
  local_138.m_string.d.d = (pQVar14->m_projectFile).d.d;
  local_138.m_string.d.ptr = (pQVar14->m_projectFile).d.ptr;
  local_138.m_string.d.size = (pQVar14->m_projectFile).d.size;
  if ((ProString *)local_138.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((ProString *)local_138.m_string.d.d)->m_string).d.d =
         *(int *)&(((ProString *)local_138.m_string.d.d)->m_string).d.d + 1;
    UNLOCK();
  }
  QString::QString(&local_88.m_string,(QChar)0x2f);
  QString::section(&local_108,&local_138,&local_88,0xffffffffffffffff,0xffffffffffffffff,0);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProString::ProString(&local_88,&local_108.m_string);
  qv(&local_b8.m_string,&local_88);
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_b8);
  Qt::endl(pQVar9);
  if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_108.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_108.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_138.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar14 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_ABSOLUTE_SOURCE_PATH");
  bVar7 = QMakeProject::isEmpty(pQVar14,(ProKey *)&local_88);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar7) {
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_SOURCE_DIR =");
    pQVar14 = this->project;
    ProKey::ProKey((ProKey *)&local_b8,"QMAKE_ABSOLUTE_SOURCE_PATH");
    QMakeEvaluator::first(&local_88,&pQVar14->super_QMakeEvaluator,(ProKey *)&local_b8);
    qv(&local_108.m_string,&local_88);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_108);
    Qt::endl(pQVar9);
    if (&(local_108.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_108.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_TARGET =");
  pQVar14 = this->project;
  ProKey::ProKey((ProKey *)&local_b8,"LIB_TARGET");
  QMakeEvaluator::first(&local_88,&pQVar14->super_QMakeEvaluator,(ProKey *)&local_b8);
  qv(&local_108.m_string,&local_88);
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_108);
  Qt::endl(pQVar9);
  if (&(local_108.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_108.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar14 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_DEFINES");
  bVar7 = QMakeProject::isEmpty(pQVar14,(ProKey *)&local_88);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar7) {
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_DEFINES =");
    pQVar14 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_DEFINES");
    pPVar10 = QMakeEvaluator::valuesRef(&pQVar14->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar10);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_b8);
    Qt::endl(pQVar9);
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar14 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CFLAGS");
  bVar7 = QMakeProject::isEmpty(pQVar14,(ProKey *)&local_88);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar7) {
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_CFLAGS =");
    pQVar14 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CFLAGS");
    pPVar10 = QMakeEvaluator::valuesRef(&pQVar14->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar10);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_b8);
    Qt::endl(pQVar9);
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar14 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CXXFLAGS");
  bVar7 = QMakeProject::isEmpty(pQVar14,(ProKey *)&local_88);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar7) {
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_CXXFLAGS =");
    pQVar14 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CXXFLAGS");
    pPVar10 = QMakeEvaluator::valuesRef(&pQVar14->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar10);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_b8);
    Qt::endl(pQVar9);
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar14 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"CONFIG");
  bVar7 = QMakeProject::isEmpty(pQVar14,(ProKey *)&local_88);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar7) {
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_CONFIG =");
    pQVar14 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"CONFIG");
    pPVar10 = QMakeEvaluator::valuesRef(&pQVar14->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar10);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_b8);
    Qt::endl(pQVar9);
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar14 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"TARGET_VERSION_EXT");
  bVar7 = QMakeProject::isEmpty(pQVar14,(ProKey *)&local_88);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar7) {
    pQVar14 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"VERSION");
    bVar7 = QMakeProject::isEmpty(pQVar14,(ProKey *)&local_88);
    if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar7) goto LAB_001651b8;
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_VERSION = ");
    pQVar14 = this->project;
    str = "VERSION";
  }
  else {
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_VERSION = ");
    pQVar14 = this->project;
    str = "TARGET_VERSION_EXT";
  }
  ProKey::ProKey((ProKey *)&local_b8,str);
  QMakeEvaluator::first(&local_88,&pQVar14->super_QMakeEvaluator,(ProKey *)&local_b8);
  pQVar9 = operator<<(pQVar9,&local_88);
  Qt::endl(pQVar9);
  if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_001651b8:
  pQVar14 = this->project;
  pPVar15 = &local_88;
  QVar16.m_data = (storage_type *)0x9;
  QVar16.m_size = (qsizetype)pPVar15;
  QString::fromUtf8(QVar16);
  pDVar5 = local_88.m_string.d.d;
  config.m_data = local_88.m_string.d.ptr;
  config.m_size = local_88.m_string.d.size;
  bVar7 = QMakeEvaluator::isActiveConfig(&pQVar14->super_QMakeEvaluator,config,false);
  if (bVar7) {
    bVar8 = true;
  }
  else {
    pQVar14 = this->project;
    QVar17.m_data = (storage_type *)0xb;
    QVar17.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar17);
    pPVar15 = (ProString *)local_88.m_string.d.d;
    config_00.m_data = local_88.m_string.d.ptr;
    config_00.m_size = local_88.m_string.d.size;
    bVar8 = QMakeEvaluator::isActiveConfig(&pQVar14->super_QMakeEvaluator,config_00,false);
  }
  if (!bVar7 && pPVar15 != (ProString *)0x0) {
    LOCK();
    *(int *)&(pPVar15->m_string).d.d = *(int *)&(pPVar15->m_string).d.d + -1;
    UNLOCK();
    if (*(int *)&(pPVar15->m_string).d.d == 0) {
      QArrayData::deallocate((QArrayData *)pPVar15,2,0x10);
    }
  }
  if ((ProString *)pDVar5 != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d =
         *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
    }
  }
  if (bVar8 != false) {
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (ProString *)0x0;
    local_d8.size = 0;
    pQVar14 = this->project;
    QVar18.m_data = (storage_type *)0x9;
    QVar18.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar18);
    pDVar5 = local_88.m_string.d.d;
    config_01.m_data = local_88.m_string.d.ptr;
    config_01.m_size = local_88.m_string.d.size;
    bVar7 = QMakeEvaluator::isActiveConfig(&pQVar14->super_QMakeEvaluator,config_01,false);
    if ((ProString *)pDVar5 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d =
           *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if (bVar7) {
      ProString::ProString(&local_88,"LIBS");
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_d8,local_d8.size,&local_88);
      QList<ProString>::end((QList<ProString> *)&local_d8);
      ProString::ProString(&local_b8,"LIBS_PRIVATE");
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_d8,local_d8.size,&local_b8);
      QList<ProString>::end((QList<ProString> *)&local_d8);
      ProString::ProString(&local_108,"QMAKE_LIBS");
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_d8,local_d8.size,&local_108);
      QList<ProString>::end((QList<ProString> *)&local_d8);
      ProString::ProString(&local_138,"QMAKE_LIBS_PRIVATE");
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_d8,local_d8.size,&local_138);
      QList<ProString>::end((QList<ProString> *)&local_d8);
      if ((ProString *)local_138.m_string.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_108.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_108.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      ProString::ProString(&local_88,"LIBS");
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_d8,local_d8.size,&local_88);
      QList<ProString>::end((QList<ProString> *)&local_d8);
      ProString::ProString(&local_b8,"QMAKE_LIBS");
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_d8,local_d8.size,&local_b8);
      QList<ProString>::end((QList<ProString> *)&local_d8);
    }
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QTextStream::operator<<(t,"QMAKE_PRL_LIBS =");
    iVar11 = QList<ProString>::begin((QList<ProString> *)&local_d8);
    iVar12 = QList<ProString>::end((QList<ProString> *)&local_d8);
    if (iVar11.i != iVar12.i) {
      do {
        pPVar10 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,(ProKey *)iVar11.i)
        ;
        qv(&local_88.m_string,pPVar10);
        QTextStream::operator<<(t,(QString *)&local_88);
        if ((ProString *)local_88.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_88.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        iVar11.i = iVar11.i + 1;
        iVar12 = QList<ProString>::end((QList<ProString> *)&local_d8);
      } while (iVar11.i != iVar12.i);
    }
    Qt::endl(t);
    QTextStream::operator<<(t,"QMAKE_PRL_LIBS_FOR_CMAKE = ");
    local_b8.m_string.d.d = (Data *)0x0;
    local_b8.m_string.d.ptr = (char16_t *)0x0;
    local_b8.m_string.d.size = 0;
    iVar11 = QList<ProString>::begin((QList<ProString> *)&local_d8);
    iVar12 = QList<ProString>::end((QList<ProString> *)&local_d8);
    if (iVar11.i != iVar12.i) {
      do {
        pQVar9 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_b8);
        pPVar10 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,(ProKey *)iVar11.i)
        ;
        ProStringList::join(&local_108.m_string,pPVar10,(QChar)0x3b);
        QVar19.m_data = (storage_type *)0x2;
        QVar19.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar19);
        local_138.m_string.d.d = local_88.m_string.d.d;
        local_138.m_string.d.ptr = local_88.m_string.d.ptr;
        local_138.m_string.d.size = local_88.m_string.d.size;
        pQVar13 = (QString *)
                  QString::replace((QChar)(char16_t)&local_108,(QString *)0x5c,
                                   (CaseSensitivity)&local_138);
        QTextStream::operator<<(pQVar9,pQVar13);
        if ((ProString *)local_138.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_138.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_108.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_108.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_108.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QString::operator=(&local_b8.m_string,(QChar)0x3b);
        iVar11.i = iVar11.i + 1;
        iVar12 = QList<ProString>::end((QList<ProString> *)&local_d8);
      } while (iVar11.i != iVar12.i);
    }
    Qt::endl(t);
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
  }
  if ((ProString *)local_58.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writePrlFile(QTextStream &t)
{
    QString bdir = Option::output_dir;
    if(bdir.isEmpty())
        bdir = qmake_getpwd();
    t << "QMAKE_PRL_BUILD_DIR =" << qv(bdir) << Qt::endl;

    t << "QMAKE_PRO_INPUT =" << qv(project->projectFile().section('/', -1)) << Qt::endl;

    if(!project->isEmpty("QMAKE_ABSOLUTE_SOURCE_PATH"))
        t << "QMAKE_PRL_SOURCE_DIR =" << qv(project->first("QMAKE_ABSOLUTE_SOURCE_PATH")) << Qt::endl;
    t << "QMAKE_PRL_TARGET =" << qv(project->first("LIB_TARGET")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_DEFINES"))
        t << "QMAKE_PRL_DEFINES =" << qv(project->values("PRL_EXPORT_DEFINES")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_CFLAGS"))
        t << "QMAKE_PRL_CFLAGS =" << qv(project->values("PRL_EXPORT_CFLAGS")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_CXXFLAGS"))
        t << "QMAKE_PRL_CXXFLAGS =" << qv(project->values("PRL_EXPORT_CXXFLAGS")) << Qt::endl;
    if(!project->isEmpty("CONFIG"))
        t << "QMAKE_PRL_CONFIG =" << qv(project->values("CONFIG")) << Qt::endl;
    if(!project->isEmpty("TARGET_VERSION_EXT"))
        t << "QMAKE_PRL_VERSION = " << project->first("TARGET_VERSION_EXT") << Qt::endl;
    else if(!project->isEmpty("VERSION"))
        t << "QMAKE_PRL_VERSION = " << project->first("VERSION") << Qt::endl;
    if(project->isActiveConfig("staticlib") || project->isActiveConfig("explicitlib")) {
        ProStringList libs;
        if (!project->isActiveConfig("staticlib"))
            libs << "LIBS" << "QMAKE_LIBS";
        else
            libs << "LIBS" << "LIBS_PRIVATE" << "QMAKE_LIBS" << "QMAKE_LIBS_PRIVATE";
        t << "QMAKE_PRL_LIBS =";
        for (ProStringList::Iterator it = libs.begin(); it != libs.end(); ++it)
            t << qv(project->values((*it).toKey()));
        t << Qt::endl;

        t << "QMAKE_PRL_LIBS_FOR_CMAKE = ";
        QString sep;
        for (ProStringList::Iterator it = libs.begin(); it != libs.end(); ++it) {
            t << sep << project->values((*it).toKey()).join(';').replace('\\', "\\\\");
            sep = ';';
        }
        t << Qt::endl;
    }
}